

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O0

void jsoncons::
     encode_traits<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,wchar_t,void>
     ::encode<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *val,basic_json_visitor<wchar_t> *encoder,
               basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *proto,
               error_code *ec)

{
  bool bVar1;
  basic_json_visitor<wchar_t> *pbVar2;
  error_code *in_RCX;
  ser_context *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  error_code *in_stack_00000008;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *in_stack_00000010;
  basic_json_visitor<wchar_t> *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff90;
  basic_json_visitor<wchar_t> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40 [3];
  ser_context local_28;
  error_code *local_20;
  ser_context *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  pbVar2 = (basic_json_visitor<wchar_t> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(in_RDI);
  local_28._vptr_ser_context = (_func_int **)0x0;
  ser_context::ser_context(&local_28);
  basic_json_visitor<wchar_t>::begin_array
            (pbVar2,(size_t)in_RSI,(semantic_tag)((ulong)in_stack_ffffffffffffff90 >> 0x38),
             (ser_context *)in_stack_ffffffffffffff88,(error_code *)0xa14ea4);
  ser_context::~ser_context(&local_28);
  bVar1 = std::error_code::operator_cast_to_bool(local_20);
  if (!bVar1) {
    local_40[0]._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   (in_stack_ffffffffffffff88);
    while( true ) {
      local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           (in_stack_ffffffffffffff88);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff90,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffff88);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(local_40);
      encode_traits<std::__cxx11::string,wchar_t,void>::
      encode<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
                (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
      bVar1 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar1) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(local_40);
    }
    local_50._vptr_basic_json_visitor = (_func_int **)0x0;
    pbVar2 = &local_50;
    ser_context::ser_context((ser_context *)pbVar2);
    basic_json_visitor<wchar_t>::end_array(pbVar2,local_10,(error_code *)0xa14f92);
    ser_context::~ser_context((ser_context *)&local_50);
  }
  return;
}

Assistant:

static void encode(const T& val, 
                           basic_json_visitor<CharT>& encoder, 
                           const Json& proto, 
                           std::error_code& ec)
        {
            encoder.begin_array(val.size(),semantic_tag::none,ser_context(),ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            for (auto it = std::begin(val); it != std::end(val); ++it)
            {
                encode_traits<value_type,CharT>::encode(*it, encoder, proto, ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
            }
            encoder.end_array(ser_context(), ec);
        }